

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O0

Cnf_Dat_t * Cnf_ManWriteCnfOther(Cnf_Man_t *p,Vec_Ptr_t *vMapped)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  Cnf_Dat_t *pCVar5;
  int **ppiVar6;
  int *piVar7;
  void *pvVar8;
  Vec_Int_t *vCover_00;
  Cnf_Cut_t *pCVar9;
  uint *puVar10;
  Aig_Obj_t *pAVar11;
  int local_ec;
  int Cube;
  int nClauses;
  int nLiterals;
  int k;
  int i;
  uint uTruth;
  int **pClas;
  int *pLits;
  int pVars [32];
  int PoVar;
  int OutVar;
  Vec_Int_t *vSopTemp;
  Vec_Int_t *vCover;
  Cnf_Cut_t *pCut;
  Cnf_Dat_t *pCnf;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vMapped_local;
  Cnf_Man_t *p_local;
  
  iVar1 = Aig_ManCoNum(p->pManAig);
  Cube = iVar1 * 4 + 1;
  iVar1 = Aig_ManCoNum(p->pManAig);
  local_ec = iVar1 * 2 + 1;
  for (nLiterals = 0; iVar1 = Vec_PtrSize(vMapped), nLiterals < iVar1; nLiterals = nLiterals + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(vMapped,nLiterals);
    iVar1 = Aig_ObjIsNode(pAVar4);
    if (iVar1 == 0) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                    ,0x1b2,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
    }
    pCVar9 = Cnf_ObjBestCut(pAVar4);
    if (pCVar9->nFanins < '\x05') {
      puVar10 = Cnf_CutTruth(pCVar9);
      uVar2 = *puVar10 & 0xffff;
      iVar3 = Cnf_SopCountLiterals(p->pSops[uVar2],(int)p->pSopSizes[uVar2]);
      iVar3 = iVar3 + p->pSopSizes[uVar2];
      if (p->pSopSizes[uVar2] < '\0') {
        __assert_fail("p->pSopSizes[uTruth] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                      ,0x1b9,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
      }
      iVar1 = (int)p->pSopSizes[uVar2];
    }
    else {
      iVar3 = Cnf_IsopCountLiterals(pCVar9->vIsop[1],(int)pCVar9->nFanins);
      iVar1 = Vec_IntSize(pCVar9->vIsop[1]);
      iVar3 = iVar3 + iVar1;
      iVar1 = Vec_IntSize(pCVar9->vIsop[1]);
    }
    Cube = iVar3 + Cube;
    local_ec = iVar1 + local_ec;
    if (pCVar9->nFanins < '\x05') {
      puVar10 = Cnf_CutTruth(pCVar9);
      uVar2 = (*puVar10 ^ 0xffffffff) & 0xffff;
      iVar3 = Cnf_SopCountLiterals(p->pSops[uVar2],(int)p->pSopSizes[uVar2]);
      iVar3 = iVar3 + p->pSopSizes[uVar2];
      if (p->pSopSizes[uVar2] < '\0') {
        __assert_fail("p->pSopSizes[uTruth] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                      ,0x1c6,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
      }
      iVar1 = (int)p->pSopSizes[uVar2];
    }
    else {
      iVar3 = Cnf_IsopCountLiterals(pCVar9->vIsop[0],(int)pCVar9->nFanins);
      iVar1 = Vec_IntSize(pCVar9->vIsop[0]);
      iVar3 = iVar3 + iVar1;
      iVar1 = Vec_IntSize(pCVar9->vIsop[0]);
    }
    Cube = iVar3 + Cube;
    local_ec = iVar1 + local_ec;
  }
  pCVar5 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar5->pMan = p->pManAig;
  pCVar5->nLiterals = Cube;
  pCVar5->nClauses = local_ec;
  ppiVar6 = (int **)malloc((long)(local_ec + 1) << 3);
  pCVar5->pClauses = ppiVar6;
  piVar7 = (int *)malloc((long)Cube << 2);
  *pCVar5->pClauses = piVar7;
  pCVar5->pClauses[local_ec] = *pCVar5->pClauses + Cube;
  iVar1 = Aig_ManObjNumMax(p->pManAig);
  piVar7 = (int *)malloc((long)iVar1 << 2);
  pCVar5->pObj2Clause = piVar7;
  iVar1 = Aig_ManObjNumMax(p->pManAig);
  piVar7 = (int *)malloc((long)iVar1 << 2);
  pCVar5->pObj2Count = piVar7;
  for (nLiterals = 0; iVar1 = Aig_ManObjNumMax(p->pManAig), nLiterals < iVar1;
      nLiterals = nLiterals + 1) {
    pCVar5->pObj2Count[nLiterals] = -1;
    pCVar5->pObj2Clause[nLiterals] = -1;
  }
  iVar1 = Aig_ManObjNumMax(p->pManAig);
  pCVar5->nVars = iVar1;
  for (nLiterals = 0; iVar1 = Vec_PtrSize(p->pManAig->vCis), nLiterals < iVar1;
      nLiterals = nLiterals + 1) {
    pvVar8 = Vec_PtrEntry(p->pManAig->vCis,nLiterals);
    pCVar5->pObj2Count[*(int *)((long)pvVar8 + 0x24)] = 0;
  }
  vCover_00 = Vec_IntAlloc(0x10000);
  pClas = (int **)*pCVar5->pClauses;
  _i = pCVar5->pClauses;
  for (nLiterals = 0; iVar1 = Vec_PtrSize(vMapped), nLiterals < iVar1; nLiterals = nLiterals + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(vMapped,nLiterals);
    pCVar5->pObj2Clause[pAVar4->Id] = (int)((long)_i - (long)pCVar5->pClauses >> 3);
    pCVar5->pObj2Count[pAVar4->Id] = 0;
    pCVar9 = Cnf_ObjBestCut(pAVar4);
    pVars[0x1f] = pAVar4->Id;
    for (nClauses = 0; nClauses < pCVar9->nFanins; nClauses = nClauses + 1) {
      pVars[(long)nClauses + -2] = *(int *)((long)pCVar9[1].vIsop + (long)nClauses * 4 + -8);
      iVar1 = pVars[(long)nClauses + -2];
      iVar3 = Aig_ManObjNumMax(p->pManAig);
      if (iVar3 < iVar1) {
        __assert_fail("pVars[k] <= Aig_ManObjNumMax(p->pManAig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                      ,500,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
      }
    }
    if (pCVar9->nFanins < '\x05') {
      puVar10 = Cnf_CutTruth(pCVar9);
      Cnf_SopConvertToVector
                (p->pSops[*puVar10 & 0xffff],(int)p->pSopSizes[*puVar10 & 0xffff],vCover_00);
      vSopTemp = vCover_00;
    }
    else {
      vSopTemp = pCVar9->vIsop[1];
    }
    for (nClauses = 0; iVar1 = Vec_IntSize(vSopTemp), nClauses < iVar1; nClauses = nClauses + 1) {
      iVar1 = Vec_IntEntry(vSopTemp,nClauses);
      *_i = (int *)pClas;
      *(int *)pClas = pVars[0x1f] << 1;
      iVar1 = Cnf_IsopWriteCube(iVar1,(int)pCVar9->nFanins,(int *)&pLits,(int *)((long)pClas + 4));
      pClas = (int **)((int *)((long)pClas + 4) + iVar1);
      _i = _i + 1;
    }
    iVar1 = Vec_IntSize(vSopTemp);
    pCVar5->pObj2Count[pAVar4->Id] = iVar1 + pCVar5->pObj2Count[pAVar4->Id];
    if (pCVar9->nFanins < '\x05') {
      puVar10 = Cnf_CutTruth(pCVar9);
      uVar2 = (*puVar10 ^ 0xffffffff) & 0xffff;
      Cnf_SopConvertToVector(p->pSops[uVar2],(int)p->pSopSizes[uVar2],vCover_00);
      vSopTemp = vCover_00;
    }
    else {
      vSopTemp = pCVar9->vIsop[0];
    }
    for (nClauses = 0; iVar1 = Vec_IntSize(vSopTemp), nClauses < iVar1; nClauses = nClauses + 1) {
      iVar1 = Vec_IntEntry(vSopTemp,nClauses);
      *_i = (int *)pClas;
      *(int *)pClas = pVars[0x1f] * 2 + 1;
      iVar1 = Cnf_IsopWriteCube(iVar1,(int)pCVar9->nFanins,(int *)&pLits,(int *)((long)pClas + 4));
      pClas = (int **)((int *)((long)pClas + 4) + iVar1);
      _i = _i + 1;
    }
    iVar1 = Vec_IntSize(vSopTemp);
    pCVar5->pObj2Count[pAVar4->Id] = iVar1 + pCVar5->pObj2Count[pAVar4->Id];
  }
  Vec_IntFree(vCover_00);
  for (nLiterals = 0; iVar1 = Vec_PtrSize(p->pManAig->vCos), nLiterals < iVar1;
      nLiterals = nLiterals + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vCos,nLiterals);
    pCVar5->pObj2Clause[pAVar4->Id] = (int)((long)_i - (long)pCVar5->pClauses >> 3);
    pCVar5->pObj2Count[pAVar4->Id] = 2;
    pAVar11 = Aig_ObjFanin0(pAVar4);
    pVars[0x1f] = pAVar11->Id;
    pVars[0x1e] = pAVar4->Id;
    ppiVar6 = _i + 1;
    *_i = (int *)pClas;
    *(int *)pClas = pVars[0x1e] << 1;
    iVar1 = pVars[0x1f] * 2;
    iVar3 = Aig_ObjFaninC0(pAVar4);
    *(uint *)((long)pClas + 4) = iVar1 + (uint)((iVar3 != 0 ^ 0xffU) & 1);
    _i = _i + 2;
    *ppiVar6 = (int *)(pClas + 1);
    piVar7 = (int *)((long)pClas + 0xc);
    *(int *)(pClas + 1) = pVars[0x1e] * 2 + 1;
    iVar1 = pVars[0x1f] * 2;
    iVar3 = Aig_ObjFaninC0(pAVar4);
    pClas = pClas + 2;
    *piVar7 = iVar1 + iVar3;
  }
  ppiVar6 = pCVar5->pClauses;
  piVar7 = pCVar5->pObj2Clause;
  pAVar4 = Aig_ManConst1(p->pManAig);
  piVar7[pAVar4->Id] = (int)((long)_i - (long)ppiVar6 >> 3);
  piVar7 = pCVar5->pObj2Count;
  pAVar4 = Aig_ManConst1(p->pManAig);
  piVar7[pAVar4->Id] = 1;
  pAVar4 = Aig_ManConst1(p->pManAig);
  pVars[0x1f] = pAVar4->Id;
  *_i = (int *)pClas;
  *(int *)pClas = pVars[0x1f] << 1;
  if ((long)pClas + (4 - (long)*pCVar5->pClauses) >> 2 != (long)Cube) {
    __assert_fail("pLits - pCnf->pClauses[0] == nLiterals",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                  ,0x237,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
  }
  if ((long)_i + (8 - (long)pCVar5->pClauses) >> 3 != (long)local_ec) {
    __assert_fail("pClas - pCnf->pClauses == nClauses",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfWrite.c"
                  ,0x238,"Cnf_Dat_t *Cnf_ManWriteCnfOther(Cnf_Man_t *, Vec_Ptr_t *)");
  }
  return pCVar5;
}

Assistant:

Cnf_Dat_t * Cnf_ManWriteCnfOther( Cnf_Man_t * p, Vec_Ptr_t * vMapped )
{
    Aig_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    Cnf_Cut_t * pCut;
    Vec_Int_t * vCover, * vSopTemp;
    int OutVar, PoVar, pVars[32], * pLits, ** pClas;
    unsigned uTruth;
    int i, k, nLiterals, nClauses, Cube;

    // count the number of literals and clauses
    nLiterals = 1 + 4 * Aig_ManCoNum( p->pManAig );
    nClauses  = 1 + 2 * Aig_ManCoNum( p->pManAig );
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        pCut = Cnf_ObjBestCut( pObj );
        // positive polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & *Cnf_CutTruth(pCut);
            nLiterals += Cnf_SopCountLiterals( p->pSops[uTruth], p->pSopSizes[uTruth] ) + p->pSopSizes[uTruth];
            assert( p->pSopSizes[uTruth] >= 0 );
            nClauses += p->pSopSizes[uTruth];
        }
        else
        {
            nLiterals += Cnf_IsopCountLiterals( pCut->vIsop[1], pCut->nFanins ) + Vec_IntSize(pCut->vIsop[1]);
            nClauses += Vec_IntSize(pCut->vIsop[1]);
        }
        // negative polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & ~*Cnf_CutTruth(pCut);
            nLiterals += Cnf_SopCountLiterals( p->pSops[uTruth], p->pSopSizes[uTruth] ) + p->pSopSizes[uTruth];
            assert( p->pSopSizes[uTruth] >= 0 );
            nClauses += p->pSopSizes[uTruth];
        }
        else
        {
            nLiterals += Cnf_IsopCountLiterals( pCut->vIsop[0], pCut->nFanins ) + Vec_IntSize(pCut->vIsop[0]);
            nClauses += Vec_IntSize(pCut->vIsop[0]);
        }
    }

    // allocate CNF
    pCnf = ABC_CALLOC( Cnf_Dat_t, 1 );
    pCnf->pMan = p->pManAig;
    pCnf->nLiterals = nLiterals;
    pCnf->nClauses  = nClauses;
    pCnf->pClauses  = ABC_ALLOC( int *, nClauses + 1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLiterals );
    pCnf->pClauses[nClauses] = pCnf->pClauses[0] + nLiterals;
    // create room for variable numbers
    pCnf->pObj2Clause = ABC_ALLOC( int, Aig_ManObjNumMax(p->pManAig) );
    pCnf->pObj2Count  = ABC_ALLOC( int, Aig_ManObjNumMax(p->pManAig) );
    for ( i = 0; i < Aig_ManObjNumMax(p->pManAig); i++ )
        pCnf->pObj2Clause[i] = pCnf->pObj2Count[i] = -1;
    pCnf->nVars = Aig_ManObjNumMax(p->pManAig);

    // clear the PI counters
    Aig_ManForEachCi( p->pManAig, pObj, i )
        pCnf->pObj2Count[pObj->Id] = 0;

    // assign the clauses
    vSopTemp = Vec_IntAlloc( 1 << 16 );
    pLits = pCnf->pClauses[0];
    pClas = pCnf->pClauses;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMapped, pObj, i )
    {
        // remember the starting clause
        pCnf->pObj2Clause[pObj->Id] = pClas - pCnf->pClauses;
        pCnf->pObj2Count[pObj->Id] = 0;

        // get the best cut
        pCut = Cnf_ObjBestCut( pObj );
        // save variables of this cut
        OutVar = pObj->Id;
        for ( k = 0; k < (int)pCut->nFanins; k++ )
        {
            pVars[k] = pCut->pFanins[k];
            assert( pVars[k] <= Aig_ManObjNumMax(p->pManAig) );
        }

        // positive polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & *Cnf_CutTruth(pCut);
            Cnf_SopConvertToVector( p->pSops[uTruth], p->pSopSizes[uTruth], vSopTemp );
            vCover = vSopTemp;
        }
        else
            vCover = pCut->vIsop[1];
        Vec_IntForEachEntry( vCover, Cube, k )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar; 
            pLits += Cnf_IsopWriteCube( Cube, pCut->nFanins, pVars, pLits );
        }
        pCnf->pObj2Count[pObj->Id] += Vec_IntSize(vCover);

        // negative polarity of the cut
        if ( pCut->nFanins < 5 )
        {
            uTruth = 0xFFFF & ~*Cnf_CutTruth(pCut);
            Cnf_SopConvertToVector( p->pSops[uTruth], p->pSopSizes[uTruth], vSopTemp );
            vCover = vSopTemp;
        }
        else
            vCover = pCut->vIsop[0];
        Vec_IntForEachEntry( vCover, Cube, k )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar + 1; 
            pLits += Cnf_IsopWriteCube( Cube, pCut->nFanins, pVars, pLits );
        }
        pCnf->pObj2Count[pObj->Id] += Vec_IntSize(vCover);
    }
    Vec_IntFree( vSopTemp );

    // write the output literals
    Aig_ManForEachCo( p->pManAig, pObj, i )
    {
        // remember the starting clause
        pCnf->pObj2Clause[pObj->Id] = pClas - pCnf->pClauses;
        pCnf->pObj2Count[pObj->Id] = 2;
        // get variables
        OutVar = Aig_ObjFanin0(pObj)->Id;
        PoVar = pObj->Id;
        // first clause
        *pClas++ = pLits;
        *pLits++ = 2 * PoVar; 
        *pLits++ = 2 * OutVar + !Aig_ObjFaninC0(pObj); 
        // second clause
        *pClas++ = pLits;
        *pLits++ = 2 * PoVar + 1; 
        *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
    }
 
    // remember the starting clause
    pCnf->pObj2Clause[Aig_ManConst1(p->pManAig)->Id] = pClas - pCnf->pClauses;
    pCnf->pObj2Count[Aig_ManConst1(p->pManAig)->Id] = 1;
    // write the constant literal
    OutVar = Aig_ManConst1(p->pManAig)->Id;
    *pClas++ = pLits;
    *pLits++ = 2 * OutVar; 

    // verify that the correct number of literals and clauses was written
    assert( pLits - pCnf->pClauses[0] == nLiterals );
    assert( pClas - pCnf->pClauses == nClauses );
//Cnf_DataPrint( pCnf, 1 );
    return pCnf;
}